

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O1

bool __thiscall Jupiter::HTTP::Server::Data::has(Data *this,string_view hostname,string_view name)

{
  pointer puVar1;
  Host *pHVar2;
  pointer puVar3;
  __uniq_ptr_data<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>,_true,_true>
  _Var4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  int iVar8;
  size_t sVar9;
  size_t __n;
  unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_> *host;
  pointer puVar10;
  uint uVar11;
  size_t sVar12;
  pointer puVar13;
  basic_string_view<char,_std::char_traits<char>_> lhs;
  undefined4 local_4c;
  
  __n = name._M_len;
  if (hostname._M_len == 0) {
    uVar11 = 0;
  }
  else {
    sVar12 = 0;
    uVar11 = 0;
    do {
      iVar8 = jessilib::fold((int)hostname._M_str[sVar12]);
      uVar11 = uVar11 + iVar8;
      sVar12 = sVar12 + 1;
    } while (hostname._M_len != sVar12);
  }
  puVar10 = (this->m_hosts).
            super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_hosts).
           super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar10 != puVar1) {
    local_4c = SUB84(puVar1,0);
    do {
      pHVar2 = (puVar10->_M_t).
               super___uniq_ptr_impl<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>
               ._M_t.
               super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Host_*,_std::default_delete<Jupiter::HTTP::Server::Host>_>
               .super__Head_base<0UL,_Jupiter::HTTP::Server::Host_*,_false>._M_head_impl;
      bVar5 = true;
      if ((uVar11 == (pHVar2->super_Directory).name_checksum) &&
         (lhs._M_str = (pHVar2->super_Directory).name._M_dataplus._M_p,
         lhs._M_len = *(size_type *)((long)&(pHVar2->super_Directory).name + 8),
         bVar6 = jessilib::equalsi<char,char>(lhs,hostname), bVar6)) {
        if (__n == 0) {
          uVar11 = 0;
        }
        else {
          sVar9 = 0;
          uVar11 = 0;
          do {
            uVar11 = uVar11 + (int)name._M_str[sVar9];
            sVar9 = sVar9 + 1;
          } while (__n != sVar9);
        }
        pHVar2 = (puVar10->_M_t).
                 super___uniq_ptr_impl<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Host_*,_std::default_delete<Jupiter::HTTP::Server::Host>_>
                 .super__Head_base<0UL,_Jupiter::HTTP::Server::Host_*,_false>._M_head_impl;
        puVar3 = *(pointer *)((long)&(pHVar2->super_Directory).content + 8);
        for (puVar13 = *(pointer *)
                        &(pHVar2->super_Directory).content.
                         super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_>_>
                         ._M_impl; puVar13 != puVar3; puVar13 = puVar13 + 1) {
          _Var4.
          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ._M_t.
          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl =
               (puVar13->_M_t).
               super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
          ;
          if (((uVar11 == *(uint *)((long)_Var4.
                                          super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                                          .
                                          super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>
                                          ._M_head_impl + 0x38)) &&
              (*(size_t *)
                ((long)_Var4.
                       super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                       .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl
                + 0x20) == __n)) &&
             ((__n == 0 ||
              (iVar8 = bcmp(name._M_str,
                            *(void **)((long)_Var4.
                                             super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                                             .
                                             super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>
                                             ._M_head_impl + 0x18),__n), iVar8 == 0)))) {
            bVar5 = false;
            local_4c = 1;
          }
          else {
            bVar5 = true;
          }
          if (!bVar5) goto LAB_0012a6f2;
        }
        local_4c = 0;
LAB_0012a6f2:
        bVar5 = false;
      }
      if (!bVar5) {
        bVar7 = (byte)local_4c;
        goto LAB_0012a713;
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar1);
  }
  bVar7 = 0;
LAB_0012a713:
  return (bool)(bVar7 & 1);
}

Assistant:

bool Jupiter::HTTP::Server::Data::has(std::string_view hostname, std::string_view name) {
	unsigned int name_checksum = calc_checksumi(hostname);
	for (const auto& host : m_hosts) {
		if (name_checksum == host->name_checksum && jessilib::equalsi(host->name, hostname)) {
			name_checksum = calc_checksum(name); // switch to equalsi to make case-insensitive
			for (const auto& content : host->content) {
				if (name_checksum == content->name_checksum && content->name == name) { // switch to equalsi to make case-insensitive
					return true;
				}
			}
			return false;
		}
	}
	return false;
}